

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor_rational.hpp
# Opt level: O0

int __thiscall soplex::SLUFactorRational::init(SLUFactorRational *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  *in_stack_00000008;
  SPxMemoryException *x;
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  *in_stack_ffffffffffffff38;
  undefined2 in_stack_ffffffffffffff40;
  undefined6 in_stack_ffffffffffffff42;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff7c;
  int **in_stack_ffffffffffffff80;
  undefined8 local_70;
  undefined4 local_68;
  undefined1 local_64 [28];
  undefined4 *local_48;
  Rational *local_40;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *local_38;
  Rational *pRVar1;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *this_00;
  
  (this->super_CLUFactorRational).rowMemMult = 5.0;
  (this->super_CLUFactorRational).colMemMult = 5.0;
  (this->super_CLUFactorRational).lMemMult = 1.0;
  (this->super_CLUFactorRational).l.firstUpdate = 0;
  (this->super_CLUFactorRational).l.firstUnused = 0;
  (this->super_CLUFactorRational).thedim = 0;
  this->usetup = false;
  local_64._0_4_ = 1;
  pRVar1 = &(this->super_CLUFactorRational).maxabs;
  local_38 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              *)local_64;
  local_64._4_8_ = this;
  this_00 = local_38;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
  ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
               *)CONCAT62(in_stack_ffffffffffffff42,in_stack_ffffffffffffff40),
              (longlong)in_stack_ffffffffffffff38);
  local_68 = 1;
  local_40 = &(this->super_CLUFactorRational).initMaxabs;
  local_48 = &local_68;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
  ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
               *)CONCAT62(in_stack_ffffffffffffff42,in_stack_ffffffffffffff40),
              (longlong)in_stack_ffffffffffffff38);
  local_64._12_8_ = &this->minThreshold;
  local_64._20_8_ = &this->lastThreshold;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
               *)CONCAT62(in_stack_ffffffffffffff42,in_stack_ffffffffffffff40),
              in_stack_ffffffffffffff38);
  local_70 = 0x3fa47ae147ae147b;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
  ::operator=(in_stack_00000008,(longdouble)CONCAT28((short)&local_70,&this->minStability));
  (this->super_CLUFactorRational).stat = UNLOADED;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::clear((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::clear(in_stack_ffffffffffffff48);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::clear(in_stack_ffffffffffffff48);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::clear(in_stack_ffffffffffffff48);
  (this->super_CLUFactorRational).u.col.size = 100;
  (this->super_CLUFactorRational).l.startSize = 100;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim(this_00,(int)((ulong)pRVar1 >> 0x20),SUB81((ulong)pRVar1 >> 0x18,0));
  if ((this->super_CLUFactorRational).l.ridx != (int *)0x0) {
    spx_free<int*>((int **)0x1861f8);
  }
  if ((this->super_CLUFactorRational).l.rbeg != (int *)0x0) {
    spx_free<int*>((int **)0x186220);
  }
  if ((this->super_CLUFactorRational).l.rorig != (int *)0x0) {
    spx_free<int*>((int **)0x186248);
  }
  if ((this->super_CLUFactorRational).l.rperm != (int *)0x0) {
    spx_free<int*>((int **)0x186270);
  }
  if ((this->super_CLUFactorRational).u.row.idx != (int *)0x0) {
    spx_free<int*>((int **)0x186298);
  }
  if ((this->super_CLUFactorRational).u.col.idx != (int *)0x0) {
    spx_free<int*>((int **)0x1862c4);
  }
  if ((this->super_CLUFactorRational).l.idx != (int *)0x0) {
    spx_free<int*>((int **)0x1862ec);
  }
  if ((this->super_CLUFactorRational).l.start != (int *)0x0) {
    spx_free<int*>((int **)0x186314);
  }
  if ((this->super_CLUFactorRational).l.row != (int *)0x0) {
    spx_free<int*>((int **)0x18633c);
  }
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim(this_00,(int)((ulong)pRVar1 >> 0x20),SUB81((ulong)pRVar1 >> 0x18,0));
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::dim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
         *)0x186378);
  spx_alloc<int*>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  spx_alloc<int*>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim(this_00,(int)((ulong)pRVar1 >> 0x20),SUB81((ulong)pRVar1 >> 0x18,0));
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::dim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
         *)0x1863e6);
  spx_alloc<int*>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  spx_alloc<int*>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  spx_alloc<int*>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  return extraout_EAX;
}

Assistant:

inline void SLUFactorRational::init()
{
   rowMemMult    = 5;          /* factor of minimum Memory * #of nonzeros */
   colMemMult    = 5;          /* factor of minimum Memory * #of nonzeros */
   lMemMult      = 1;          /* factor of minimum Memory * #of nonzeros */

   l.firstUpdate = 0;
   l.firstUnused = 0;
   thedim        = 0;

   usetup        = false;
   maxabs        = 1;
   initMaxabs    = 1;
   lastThreshold = minThreshold;
   minStability  = SOPLEX_MINSTABILITYRAT;
   stat          = UNLOADED;

   vec.clear();
   eta.clear();
   ssvec.clear();
   forest.clear();

   u.col.size    = 100;
   l.startSize   = 100;

   l.rval.reDim(0);

   if(l.ridx)
      spx_free(l.ridx);

   if(l.rbeg)
      spx_free(l.rbeg);

   if(l.rorig)
      spx_free(l.rorig);

   if(l.rperm)
      spx_free(l.rperm);

   if(u.row.idx)
      spx_free(u.row.idx);

   if(u.col.idx)
      spx_free(u.col.idx);

   if(l.idx)
      spx_free(l.idx);

   if(l.start)
      spx_free(l.start);

   if(l.row)
      spx_free(l.row);

   // init() is used in constructor of SLUFactorRational so we have to
   // clean up if anything goes wrong here
   try
   {
      u.row.val.reDim(100);
      spx_alloc(u.row.idx, u.row.val.dim());
      spx_alloc(u.col.idx, u.col.size);

      l.val.reDim(100);
      spx_alloc(l.idx,   l.val.dim());
      spx_alloc(l.start, l.startSize);
      spx_alloc(l.row,   l.startSize);
   }
   catch(const SPxMemoryException& x)
   {
      freeAll();
      throw x;
   }
}